

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unicodeAddExceptions(unicode_tokenizer *p,int bAlnum,char *zIn,int nIn)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  byte *pbVar14;
  
  if (nIn != 0) {
    pbVar9 = (byte *)(zIn + (uint)nIn);
    iVar11 = 0;
    pbVar10 = (byte *)zIn;
    do {
      bVar1 = *pbVar10;
      uVar12 = (uint)bVar1;
      pbVar14 = pbVar10 + 1;
      pbVar10 = pbVar14;
      if (0xbf < bVar1) {
        uVar2 = (uint)""[bVar1 - 0xc0];
        for (; (pbVar10 = pbVar9, pbVar14 != pbVar9 &&
               (pbVar10 = pbVar14, (*pbVar14 & 0xffffffc0) == 0x80)); pbVar14 = pbVar14 + 1) {
          uVar2 = *pbVar14 & 0x3f | uVar2 << 6;
        }
        uVar12 = uVar2;
        if ((uVar2 & 0xfffff800) == 0xd800) {
          uVar12 = 0xfffd;
        }
        if (uVar2 < 0x80) {
          uVar12 = 0xfffd;
        }
        if ((uVar2 & 0xfffffffe) == 0xfffe) {
          uVar12 = 0xfffd;
        }
      }
      iVar3 = sqlite3FtsUnicodeIsalnum(uVar12);
      if (iVar3 != bAlnum) {
        if (uVar12 - 0x332 < 0xffffffce) {
          iVar11 = iVar11 + 1;
        }
        else {
          uVar2 = 0x361f8;
          if (uVar12 < 800) {
            uVar2 = 0x8029fdf;
          }
          iVar11 = iVar11 + (uint)((1 << ((byte)uVar12 & 0x1f) & uVar2) == 0);
        }
      }
    } while (pbVar10 < pbVar9);
    if (iVar11 == 0) {
      return 0;
    }
    piVar5 = p->aiException;
    iVar3 = p->nException;
    iVar4 = sqlite3_initialize();
    if (iVar4 != 0) {
      return 7;
    }
    piVar5 = (int *)sqlite3Realloc(piVar5,((long)iVar3 + (long)iVar11) * 4);
    if (piVar5 == (int *)0x0) {
      return 7;
    }
    uVar12 = p->nException;
    uVar13 = (ulong)uVar12;
    if (nIn != 0) {
      do {
        bVar1 = *zIn;
        uVar12 = (uint)bVar1;
        pbVar10 = (byte *)zIn + 1;
        zIn = (char *)pbVar10;
        if (0xbf < bVar1) {
          uVar2 = (uint)""[bVar1 - 0xc0];
          for (; (zIn = (char *)pbVar9, pbVar10 != pbVar9 &&
                 (zIn = (char *)pbVar10, (*pbVar10 & 0xffffffc0) == 0x80)); pbVar10 = pbVar10 + 1) {
            uVar2 = *pbVar10 & 0x3f | uVar2 << 6;
          }
          uVar12 = uVar2;
          if ((uVar2 & 0xfffff800) == 0xd800) {
            uVar12 = 0xfffd;
          }
          if (uVar2 < 0x80) {
            uVar12 = 0xfffd;
          }
          if ((uVar2 & 0xfffffffe) == 0xfffe) {
            uVar12 = 0xfffd;
          }
        }
        iVar11 = sqlite3FtsUnicodeIsalnum(uVar12);
        if (iVar11 != bAlnum) {
          if (0xffffffcd < uVar12 - 0x332) {
            uVar2 = 0x361f8;
            if (uVar12 < 800) {
              uVar2 = 0x8029fdf;
            }
            if ((uVar2 >> (uVar12 - 0x20 & 0x1f) & 1) != 0) goto LAB_001b3e67;
          }
          iVar11 = (int)uVar13;
          if (iVar11 < 1) {
            uVar7 = 0;
          }
          else {
            uVar6 = 0;
            do {
              uVar7 = uVar6;
              if ((int)uVar12 <= piVar5[uVar6]) break;
              uVar6 = uVar6 + 1;
              uVar7 = uVar13;
            } while (uVar13 != uVar6);
          }
          if ((int)uVar7 < iVar11) {
            lVar8 = (long)iVar11;
            do {
              piVar5[lVar8] = piVar5[lVar8 + -1];
              lVar8 = lVar8 + -1;
            } while ((int)uVar7 < lVar8);
          }
          piVar5[uVar7 & 0xffffffff] = uVar12;
          uVar13 = (ulong)(iVar11 + 1);
        }
LAB_001b3e67:
        uVar12 = (uint)uVar13;
      } while (zIn < pbVar9);
    }
    p->aiException = piVar5;
    p->nException = uVar12;
  }
  return 0;
}

Assistant:

static int unicodeAddExceptions(
  unicode_tokenizer *p,           /* Tokenizer to add exceptions to */
  int bAlnum,                     /* Replace Isalnum() return value with this */
  const char *zIn,                /* Array of characters to make exceptions */
  int nIn                         /* Length of z in bytes */
){
  const unsigned char *z = (const unsigned char *)zIn;
  const unsigned char *zTerm = &z[nIn];
  unsigned int iCode;
  int nEntry = 0;

  assert( bAlnum==0 || bAlnum==1 );

  while( z<zTerm ){
    READ_UTF8(z, zTerm, iCode);
    assert( (sqlite3FtsUnicodeIsalnum((int)iCode) & 0xFFFFFFFE)==0 );
    if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum 
     && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0 
    ){
      nEntry++;
    }
  }

  if( nEntry ){
    int *aNew;                    /* New aiException[] array */
    int nNew;                     /* Number of valid entries in array aNew[] */

    aNew = sqlite3_realloc64(p->aiException,(p->nException+nEntry)*sizeof(int));
    if( aNew==0 ) return SQLITE_NOMEM;
    nNew = p->nException;

    z = (const unsigned char *)zIn;
    while( z<zTerm ){
      READ_UTF8(z, zTerm, iCode);
      if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum 
       && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0
      ){
        int i, j;
        for(i=0; i<nNew && aNew[i]<(int)iCode; i++);
        for(j=nNew; j>i; j--) aNew[j] = aNew[j-1];
        aNew[i] = (int)iCode;
        nNew++;
      }
    }
    p->aiException = aNew;
    p->nException = nNew;
  }

  return SQLITE_OK;
}